

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention_x86_fma::forward
          (MultiHeadAttention_x86_fma *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  long *plVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  Option opt1_1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  int i_1;
  Mat qkv_cross;
  Mat v_affine;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  Mat *maskm;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  int i;
  Mat qk_cross;
  Mat k_affine;
  Mat q_affine;
  int dst_seqlen;
  int src_seqlen;
  int embed_dim_per_head;
  Mat attn_mask_blob_unpacked;
  Mat *attn_mask_blob;
  Mat *v_blob;
  Mat *k_blob;
  Mat *q_blob;
  Mat *m;
  value_type *in_stack_fffffffffffff028;
  allocator_type *in_stack_fffffffffffff030;
  int in_stack_fffffffffffff038;
  int in_stack_fffffffffffff03c;
  Mat *in_stack_fffffffffffff040;
  Option *in_stack_fffffffffffff048;
  int in_stack_fffffffffffff054;
  Mat *in_stack_fffffffffffff058;
  void **ppvVar5;
  Mat *in_stack_fffffffffffff060;
  const_reference local_da8;
  const_reference local_da0;
  const_reference local_d98;
  undefined4 local_d88;
  undefined4 uStack_d84;
  undefined8 uStack_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  value_type local_d48;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_cf8;
  value_type local_ce0;
  value_type local_c98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_c48;
  int local_c2c;
  void *local_c28;
  int *local_c20;
  size_t local_c18;
  int local_c10;
  Allocator *local_c08;
  undefined4 local_c00;
  int local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined8 local_be8;
  void *local_be0;
  int *local_bd8;
  size_t local_bd0;
  int local_bc8;
  Allocator *local_bc0;
  undefined4 local_bb8;
  int local_bb4;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined8 local_ba0;
  undefined4 local_b98;
  undefined4 uStack_b94;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  value_type local_b58;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_b08;
  void *local_af0;
  int *local_ae8;
  ulong local_ae0;
  int local_ad8;
  Allocator *local_ad0;
  int local_ac8;
  int local_ac4;
  int local_ac0;
  int local_abc;
  int local_ab8;
  size_t local_ab0;
  void **local_aa8;
  value_type local_aa0;
  value_type local_a58;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a08;
  int local_9ec;
  void *local_9e8;
  int *local_9e0;
  size_t local_9d8;
  int local_9d0;
  Allocator *local_9c8;
  undefined4 local_9c0;
  int local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined8 local_9a8;
  void *local_9a0;
  int *local_998;
  size_t local_990;
  int local_988;
  Allocator *local_980;
  undefined4 local_978;
  int local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined8 local_960;
  void *local_958;
  int *local_950;
  size_t local_948;
  int local_940;
  Allocator *local_938;
  undefined4 local_930;
  int local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined4 local_920;
  undefined8 local_918;
  int local_910;
  int local_90c;
  int local_908;
  void *local_8f8;
  int *local_8f0;
  size_t local_8e8;
  int local_8e0;
  Allocator *local_8d8;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  int local_8c0;
  size_t local_8b8;
  void *local_8b0;
  int *local_8a8;
  size_t local_8a0;
  int local_898;
  Allocator *local_890;
  int local_888;
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  size_t local_870;
  void **local_868;
  const_reference local_860;
  const_reference local_858;
  const_reference local_850;
  undefined8 *local_848;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_840;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_838;
  void **local_828;
  void **local_820;
  void **local_818;
  void **local_810;
  void **local_808;
  value_type *local_800;
  value_type *local_7f0;
  void **local_7e0;
  value_type *local_7d0;
  value_type *local_7c0;
  value_type *local_7b0;
  value_type *local_7a0;
  void **local_790;
  void **local_780;
  void **local_770;
  void **local_760;
  void **local_750;
  void **local_740;
  void **local_730;
  int local_720;
  undefined4 local_71c;
  reference local_718;
  reference local_710;
  reference local_708;
  int local_700;
  undefined4 local_6fc;
  reference local_6f8;
  reference local_6f0;
  reference local_6e8;
  int local_6e0;
  undefined4 local_6dc;
  reference local_6d8;
  reference local_6d0;
  reference local_6c8;
  int local_6c0;
  undefined4 local_6bc;
  reference local_6b8;
  reference local_6b0;
  reference local_6a8;
  int local_6a0;
  undefined4 local_69c;
  reference local_698;
  reference local_690;
  reference local_688;
  int local_680;
  undefined4 local_67c;
  reference local_678;
  reference local_670;
  reference local_668;
  int local_660;
  undefined4 local_65c;
  void **local_658;
  void **local_650;
  void **local_648;
  void **local_638;
  int local_630;
  undefined4 local_62c;
  reference local_628;
  int local_620;
  undefined4 local_61c;
  reference local_618;
  int local_610;
  undefined4 local_60c;
  reference local_608;
  int local_600;
  undefined4 local_5fc;
  reference local_5f8;
  int local_5f0;
  undefined4 local_5ec;
  reference local_5e8;
  int local_5e0;
  undefined4 local_5dc;
  reference local_5d8;
  int local_5c0;
  undefined4 local_5bc;
  void **local_5b8;
  int local_5a0;
  undefined4 local_59c;
  void **local_598;
  int local_580;
  undefined4 local_57c;
  void **local_578;
  int local_560;
  undefined4 local_55c;
  void **local_558;
  int local_540;
  undefined4 local_53c;
  void **local_538;
  int local_520;
  undefined4 local_51c;
  void **local_518;
  int local_500;
  undefined4 local_4fc;
  void **local_4f8;
  int local_4e0;
  undefined4 local_4dc;
  value_type *local_4d8;
  int local_4c0;
  undefined4 local_4bc;
  value_type *local_4b8;
  int local_4a0;
  undefined4 local_49c;
  value_type *local_498;
  int local_480;
  undefined4 local_47c;
  value_type *local_478;
  int local_460;
  undefined4 local_45c;
  void **local_458;
  int local_440;
  undefined4 local_43c;
  value_type *local_438;
  int local_420;
  undefined4 local_41c;
  value_type *local_418;
  int local_410;
  undefined4 local_40c;
  void **local_408;
  int local_400;
  undefined4 local_3fc;
  void **local_3f8;
  int local_3f0;
  undefined4 local_3ec;
  void **local_3e8;
  const_reference local_3e0;
  void **local_3d8;
  void **local_3d0;
  void **local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  int local_3b0;
  int local_3ac;
  void **local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  int local_390;
  int local_38c;
  void **local_388;
  int local_380;
  int local_37c;
  void **local_378;
  value_type *local_370;
  int local_368;
  int local_364;
  void **local_360;
  value_type *local_358;
  int local_350;
  int local_34c;
  void **local_348;
  value_type *local_340;
  int local_338;
  int local_334;
  void **local_330;
  value_type *local_328;
  int local_320;
  int local_31c;
  void **local_318;
  value_type *local_310;
  int local_308;
  int local_304;
  void **local_300;
  value_type *local_2f8;
  undefined1 local_2ed;
  int local_2ec;
  void **local_2e8;
  void **local_2e0;
  void *local_2b8;
  void *local_2b0;
  void *local_2a8;
  void *local_2a0;
  void *local_290;
  void *local_280;
  void *local_270;
  void *local_260;
  void *local_250;
  void *local_240;
  void *local_230;
  void *local_220;
  void *local_210;
  void *local_200;
  void *local_1f0;
  void *local_1e0;
  void *local_1d0;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  void *local_1a8;
  void *local_1a0;
  void *local_198;
  int local_188;
  undefined4 local_184;
  void **local_180;
  int local_178;
  undefined4 local_174;
  void **local_170;
  Allocator *local_168;
  int local_15c;
  size_t local_158;
  void *local_150;
  int local_148;
  int local_144;
  value_type *local_140;
  Allocator *local_138;
  int local_12c;
  size_t local_128;
  void *local_120;
  int local_118;
  int local_114;
  value_type *local_110;
  Allocator *local_108;
  int local_fc;
  size_t local_f8;
  void *local_f0;
  int local_e8;
  int local_e4;
  value_type *local_e0;
  Allocator *local_d8;
  int local_cc;
  size_t local_c8;
  void *local_c0;
  int local_b8;
  int local_b4;
  value_type *local_b0;
  Allocator *local_a8;
  int local_9c;
  size_t local_98;
  void *local_90;
  int local_88;
  int local_84;
  value_type *local_80;
  Allocator *local_78;
  int local_6c;
  size_t local_68;
  void *local_60;
  int local_58;
  int local_54;
  value_type *local_50;
  Allocator *local_48;
  int local_3c;
  ulong local_38;
  void *local_30;
  int local_24;
  int local_20;
  int local_1c;
  void **local_18;
  undefined4 local_c;
  long local_8;
  
  local_848 = in_RCX;
  local_840 = in_RDX;
  local_838 = in_RSI;
  local_850 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_838);
  if ((sVar3 == 1) ||
     ((sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_838), sVar3 == 2 &&
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0)))) {
    local_d98 = local_850;
  }
  else {
    local_d98 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_838,1);
  }
  local_858 = local_d98;
  sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_838);
  if ((sVar3 == 1) ||
     ((sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_838), sVar3 == 2 &&
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0)))) {
    local_da0 = local_850;
  }
  else {
    sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_838);
    if ((sVar3 == 2) ||
       ((sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_838), sVar3 == 3 &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0)))) {
      local_da8 = local_858;
    }
    else {
      local_da8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_838,2);
    }
    local_da0 = local_da8;
  }
  local_860 = local_da0;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
    local_828 = &local_8b0;
    local_8b0 = (void *)0x0;
    local_8a8 = (int *)0x0;
    local_8a0 = 0;
    local_898 = 0;
    local_890 = (Allocator *)0x0;
    local_888 = 0;
    local_884 = 0;
    local_880 = 0;
    local_87c = 0;
    local_878 = 0;
    local_870 = 0;
  }
  else {
    sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_838);
    local_3e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_838,sVar3 - 1);
    local_3d8 = &local_8b0;
    local_8b0 = local_3e0->data;
    local_8a8 = local_3e0->refcount;
    local_8a0 = local_3e0->elemsize;
    local_898 = local_3e0->elempack;
    local_890 = local_3e0->allocator;
    local_888 = local_3e0->dims;
    local_884 = local_3e0->w;
    local_880 = local_3e0->h;
    local_87c = local_3e0->d;
    local_878 = local_3e0->c;
    local_870 = local_3e0->cstep;
    local_170 = local_3d8;
    if (local_8a8 != (int *)0x0) {
      local_174 = 1;
      LOCK();
      local_178 = *local_8a8;
      *local_8a8 = *local_8a8 + 1;
      UNLOCK();
    }
  }
  local_868 = &local_8b0;
  local_820 = &local_8f8;
  local_8f8 = (void *)0x0;
  local_8f0 = (int *)0x0;
  local_8e8 = 0;
  local_8e0 = 0;
  local_8d8 = (Allocator *)0x0;
  local_8d0 = 0;
  local_8cc = 0;
  local_8c8 = 0;
  local_8c4 = 0;
  local_8c0 = 0;
  local_8b8 = 0;
  if (local_898 == 1) {
    local_650 = &local_8f8;
    local_658 = local_868;
    local_648 = local_650;
    if (local_650 != local_868) {
      if (local_8a8 != (int *)0x0) {
        local_65c = 1;
        LOCK();
        local_660 = *local_8a8;
        *local_8a8 = *local_8a8 + 1;
        UNLOCK();
      }
      local_8f8 = local_8b0;
      local_8f0 = local_8a8;
      local_8e8 = local_8a0;
      local_8e0 = local_898;
      local_8d8 = local_890;
      local_8d0 = local_888;
      local_8cc = local_884;
      local_8c8 = local_880;
      local_8c4 = local_87c;
      local_8c0 = local_878;
      local_8b8 = local_870;
      local_638 = local_650;
    }
  }
  else {
    convert_packing(in_stack_fffffffffffff060,in_stack_fffffffffffff058,in_stack_fffffffffffff054,
                    in_stack_fffffffffffff048);
  }
  local_908 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
  local_90c = local_850->h * local_850->elempack;
  local_910 = local_858->h * local_858->elempack;
  local_818 = &local_958;
  local_958 = (void *)0x0;
  local_950 = (int *)0x0;
  local_948 = 0;
  local_940 = 0;
  local_938 = (Allocator *)0x0;
  local_930 = 0;
  local_92c = 0;
  local_928 = 0;
  local_924 = 0;
  local_920 = 0;
  local_918 = 0;
  (**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],local_850,&local_958,local_848);
  local_810 = &local_9a0;
  local_9a0 = (void *)0x0;
  local_998 = (int *)0x0;
  local_990 = 0;
  local_988 = 0;
  local_980 = (Allocator *)0x0;
  local_978 = 0;
  local_974 = 0;
  local_970 = 0;
  local_96c = 0;
  local_968 = 0;
  local_960 = 0;
  (**(code **)(*(long *)in_RDI[2] + 0x38))((long *)in_RDI[2],local_858,&local_9a0,local_848);
  local_3b0 = local_90c * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
  local_3c0 = local_848[1];
  local_3a8 = &local_9e8;
  local_3ac = local_910;
  local_3b8 = 4;
  local_9e8 = (void *)0x0;
  local_9e0 = (int *)0x0;
  local_9d8 = 0;
  local_9d0 = 0;
  local_9c8 = (Allocator *)0x0;
  local_9c0 = 0;
  local_9bc = 0;
  local_9b8 = 0;
  local_9b4 = 0;
  local_9b0 = 0;
  local_9a8 = 0;
  Mat::create(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff038,
              (size_t)in_stack_fffffffffffff030,(Allocator *)in_stack_fffffffffffff028);
  for (local_9ec = 0; local_9ec < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_9ec = local_9ec + 1) {
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1a334b7);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff040,
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
               in_stack_fffffffffffff030);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1a334e0);
    local_304 = local_9ec * local_908;
    local_2f8 = &local_a58;
    local_300 = &local_958;
    local_308 = local_908;
    local_144 = local_92c;
    local_150 = (void *)((long)local_958 + (long)local_92c * (long)local_304 * local_948);
    local_158 = local_948;
    local_15c = local_940;
    local_168 = local_938;
    local_140 = &local_a58;
    local_148 = local_908;
    local_a58.refcount = (int *)0x0;
    local_a58.elemsize = local_948;
    local_a58.elempack = local_940;
    local_a58.allocator = local_938;
    local_a58.dims = 2;
    local_a58.w = local_92c;
    local_a58.h = local_908;
    local_a58.d = 1;
    local_a58.c = 1;
    local_a58.cstep = (long)local_92c * (long)local_908;
    local_a58.data = local_150;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_a08,0);
    local_678 = &local_a58;
    local_670 = pvVar4;
    if (pvVar4 != local_678) {
      if (local_a58.refcount != (int *)0x0) {
        local_67c = 1;
        LOCK();
        local_680 = *local_a58.refcount;
        *local_a58.refcount = *local_a58.refcount + 1;
        UNLOCK();
      }
      local_628 = pvVar4;
      if (pvVar4->refcount != (int *)0x0) {
        piVar1 = pvVar4->refcount;
        local_62c = 0xffffffff;
        LOCK();
        local_630 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_630 == 1) {
          if (pvVar4->allocator == (Allocator *)0x0) {
            local_198 = pvVar4->data;
            if (local_198 != (void *)0x0) {
              free(local_198);
            }
          }
          else {
            (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = local_678->data;
      pvVar4->refcount = local_678->refcount;
      pvVar4->elemsize = local_678->elemsize;
      pvVar4->elempack = local_678->elempack;
      pvVar4->allocator = local_678->allocator;
      pvVar4->dims = local_678->dims;
      pvVar4->w = local_678->w;
      pvVar4->h = local_678->h;
      pvVar4->d = local_678->d;
      pvVar4->c = local_678->c;
      pvVar4->cstep = local_678->cstep;
    }
    local_800 = &local_a58;
    local_668 = pvVar4;
    local_418 = local_800;
    if (local_a58.refcount != (int *)0x0) {
      local_41c = 0xffffffff;
      LOCK();
      local_420 = *local_a58.refcount;
      *local_a58.refcount = *local_a58.refcount + -1;
      UNLOCK();
      if (local_420 == 1) {
        if (local_a58.allocator == (Allocator *)0x0) {
          local_2a0 = local_a58.data;
          if (local_a58.data != (void *)0x0) {
            free(local_a58.data);
          }
        }
        else {
          (*(local_a58.allocator)->_vptr_Allocator[3])(local_a58.allocator,local_a58.data);
        }
      }
    }
    local_a58.data = (void *)0x0;
    local_a58.elemsize = 0;
    local_a58.elempack = 0;
    local_a58.dims = 0;
    local_a58.w = 0;
    local_a58.h = 0;
    local_a58.d = 0;
    local_a58.c = 0;
    local_a58.cstep = 0;
    local_a58.refcount = (int *)0x0;
    local_31c = local_9ec * local_908;
    local_310 = &local_aa0;
    local_318 = &local_9a0;
    local_320 = local_908;
    local_114 = local_974;
    local_120 = (void *)((long)local_9a0 + (long)local_974 * (long)local_31c * local_990);
    local_128 = local_990;
    local_12c = local_988;
    local_138 = local_980;
    local_110 = &local_aa0;
    local_118 = local_908;
    local_aa0.refcount = (int *)0x0;
    local_aa0.elemsize = local_990;
    local_aa0.elempack = local_988;
    local_aa0.allocator = local_980;
    local_aa0.dims = 2;
    local_aa0.w = local_974;
    local_aa0.h = local_908;
    local_aa0.d = 1;
    local_aa0.c = 1;
    local_aa0.cstep = (long)local_974 * (long)local_908;
    local_aa0.data = local_120;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_a08,1);
    local_698 = &local_aa0;
    local_690 = pvVar4;
    if (pvVar4 != local_698) {
      if (local_aa0.refcount != (int *)0x0) {
        local_69c = 1;
        LOCK();
        local_6a0 = *local_aa0.refcount;
        *local_aa0.refcount = *local_aa0.refcount + 1;
        UNLOCK();
      }
      local_618 = pvVar4;
      if (pvVar4->refcount != (int *)0x0) {
        piVar1 = pvVar4->refcount;
        local_61c = 0xffffffff;
        LOCK();
        local_620 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_620 == 1) {
          if (pvVar4->allocator == (Allocator *)0x0) {
            local_1a0 = pvVar4->data;
            if (local_1a0 != (void *)0x0) {
              free(local_1a0);
            }
          }
          else {
            (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = local_698->data;
      pvVar4->refcount = local_698->refcount;
      pvVar4->elemsize = local_698->elemsize;
      pvVar4->elempack = local_698->elempack;
      pvVar4->allocator = local_698->allocator;
      pvVar4->dims = local_698->dims;
      pvVar4->w = local_698->w;
      pvVar4->h = local_698->h;
      pvVar4->d = local_698->d;
      pvVar4->c = local_698->c;
      pvVar4->cstep = local_698->cstep;
    }
    local_7f0 = &local_aa0;
    local_688 = pvVar4;
    local_438 = local_7f0;
    if (local_aa0.refcount != (int *)0x0) {
      local_43c = 0xffffffff;
      LOCK();
      local_440 = *local_aa0.refcount;
      *local_aa0.refcount = *local_aa0.refcount + -1;
      UNLOCK();
      if (local_440 == 1) {
        if (local_aa0.allocator == (Allocator *)0x0) {
          local_290 = local_aa0.data;
          if (local_aa0.data != (void *)0x0) {
            free(local_aa0.data);
          }
        }
        else {
          (*(local_aa0.allocator)->_vptr_Allocator[3])(local_aa0.allocator,local_aa0.data);
        }
      }
    }
    local_aa0.data = (void *)0x0;
    local_aa0.elemsize = 0;
    local_aa0.elempack = 0;
    local_aa0.dims = 0;
    local_aa0.w = 0;
    local_aa0.h = 0;
    local_aa0.d = 0;
    local_aa0.c = 0;
    local_aa0.cstep = 0;
    local_aa0.refcount = (int *)0x0;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0) {
      if (local_8d0 == 3) {
        local_2e0 = &local_af0;
        local_2e8 = &local_8f8;
        local_30 = (void *)((long)local_8f8 + local_8b8 * (long)local_9ec * local_8e8);
        local_18 = &local_af0;
        local_ae8 = (int *)0x0;
        local_abc = 1;
        local_ab8 = local_8c4;
        local_8 = (long)local_8cc * (long)local_8c8 * local_8e8;
        local_ab0 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_8e8;
        local_ac8 = 2;
        local_c = 0x10;
        local_1c = local_8cc;
        local_20 = local_8c8;
        local_24 = local_8c4;
        local_38 = local_8e8;
        local_3c = local_8e0;
        local_48 = local_8d8;
        local_2ec = local_9ec;
        local_2ed = 1;
        local_af0 = local_30;
      }
      else {
        local_3c8 = &local_af0;
        local_3d0 = &local_8f8;
        local_af0 = local_8f8;
        local_ae8 = local_8f0;
        local_ac8 = local_8d0;
        local_abc = local_8c4;
        local_ab8 = local_8c0;
        local_ab0 = local_8b8;
        local_180 = local_3c8;
        if (local_8f0 != (int *)0x0) {
          local_184 = 1;
          LOCK();
          local_188 = *local_8f0;
          *local_8f0 = *local_8f0 + 1;
          UNLOCK();
        }
      }
      local_ac0 = local_8c8;
      local_ac4 = local_8cc;
      local_ad0 = local_8d8;
      local_ad8 = local_8e0;
      local_ae0 = local_8e8;
      local_aa8 = &local_af0;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff030,
                 in_stack_fffffffffffff028);
      local_7e0 = &local_af0;
      local_458 = local_7e0;
      if (local_ae8 != (int *)0x0) {
        local_45c = 0xffffffff;
        LOCK();
        local_460 = *local_ae8;
        *local_ae8 = *local_ae8 + -1;
        UNLOCK();
        if (local_460 == 1) {
          if (local_ad0 == (Allocator *)0x0) {
            local_280 = local_af0;
            if (local_af0 != (void *)0x0) {
              free(local_af0);
            }
          }
          else {
            (*local_ad0->_vptr_Allocator[3])(local_ad0,local_af0);
          }
        }
      }
      local_af0 = (void *)0x0;
      local_ae0 = 0;
      local_ad8 = 0;
      local_ac8 = 0;
      local_ac4 = 0;
      local_ac0 = 0;
      local_abc = 0;
      local_ab8 = 0;
      local_ab0 = 0;
      local_ae8 = (int *)0x0;
    }
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1a347ec);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff040,
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
               in_stack_fffffffffffff030);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1a34815);
    local_334 = local_9ec * local_90c;
    local_328 = &local_b58;
    local_330 = &local_9e8;
    local_338 = local_90c;
    local_e4 = local_9bc;
    local_f0 = (void *)((long)local_9e8 + (long)local_9bc * (long)local_334 * local_9d8);
    local_f8 = local_9d8;
    local_fc = local_9d0;
    local_108 = local_9c8;
    local_e0 = &local_b58;
    local_e8 = local_90c;
    local_b58.refcount = (int *)0x0;
    local_b58.elemsize = local_9d8;
    local_b58.elempack = local_9d0;
    local_b58.allocator = local_9c8;
    local_b58.dims = 2;
    local_b58.w = local_9bc;
    local_b58.h = local_90c;
    local_b58.d = 1;
    local_b58.c = 1;
    local_b58.cstep = (long)local_9bc * (long)local_90c;
    local_b58.data = local_f0;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_b08,0);
    local_6b8 = &local_b58;
    local_6b0 = pvVar4;
    if (pvVar4 != local_6b8) {
      if (local_b58.refcount != (int *)0x0) {
        local_6bc = 1;
        LOCK();
        local_6c0 = *local_b58.refcount;
        *local_b58.refcount = *local_b58.refcount + 1;
        UNLOCK();
      }
      local_608 = pvVar4;
      if (pvVar4->refcount != (int *)0x0) {
        piVar1 = pvVar4->refcount;
        local_60c = 0xffffffff;
        LOCK();
        local_610 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_610 == 1) {
          if (pvVar4->allocator == (Allocator *)0x0) {
            local_1a8 = pvVar4->data;
            if (local_1a8 != (void *)0x0) {
              free(local_1a8);
            }
          }
          else {
            (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = local_6b8->data;
      pvVar4->refcount = local_6b8->refcount;
      pvVar4->elemsize = local_6b8->elemsize;
      pvVar4->elempack = local_6b8->elempack;
      pvVar4->allocator = local_6b8->allocator;
      pvVar4->dims = local_6b8->dims;
      pvVar4->w = local_6b8->w;
      pvVar4->h = local_6b8->h;
      pvVar4->d = local_6b8->d;
      pvVar4->c = local_6b8->c;
      pvVar4->cstep = local_6b8->cstep;
    }
    local_7d0 = &local_b58;
    local_6a8 = pvVar4;
    local_478 = local_7d0;
    if (local_b58.refcount != (int *)0x0) {
      local_47c = 0xffffffff;
      LOCK();
      local_480 = *local_b58.refcount;
      *local_b58.refcount = *local_b58.refcount + -1;
      UNLOCK();
      if (local_480 == 1) {
        if (local_b58.allocator == (Allocator *)0x0) {
          local_270 = local_b58.data;
          if (local_b58.data != (void *)0x0) {
            free(local_b58.data);
          }
        }
        else {
          (*(local_b58.allocator)->_vptr_Allocator[3])(local_b58.allocator,local_b58.data);
        }
      }
    }
    local_b58.data = (void *)0x0;
    local_b58.elemsize = 0;
    local_b58.elempack = 0;
    local_b58.dims = 0;
    local_b58.w = 0;
    local_b58.h = 0;
    local_b58.d = 0;
    local_b58.c = 0;
    local_b58.cstep = 0;
    local_b58.refcount = (int *)0x0;
    uStack_b90 = local_848[1];
    uStack_b88 = local_848[2];
    uStack_b80 = local_848[3];
    local_b78 = local_848[4];
    uStack_b70 = local_848[5];
    uStack_b68 = local_848[6];
    uStack_b60 = local_848[7];
    _local_b98 = CONCAT44(1,(int)*local_848);
    (**(code **)(*(long *)in_RDI[5] + 0x30))((long *)in_RDI[5],&local_a08,&local_b08,&local_b98);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff030);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff030);
  }
  local_3e8 = &local_958;
  if (local_950 != (int *)0x0) {
    local_3ec = 0xffffffff;
    LOCK();
    local_3f0 = *local_950;
    *local_950 = *local_950 + -1;
    UNLOCK();
    if (local_3f0 == 1) {
      if (local_938 == (Allocator *)0x0) {
        local_2b8 = local_958;
        if (local_958 != (void *)0x0) {
          free(local_958);
        }
      }
      else {
        (*local_938->_vptr_Allocator[3])(local_938,local_958);
      }
    }
  }
  local_958 = (void *)0x0;
  local_948 = 0;
  local_940 = 0;
  local_930 = 0;
  local_92c = 0;
  local_928 = 0;
  local_924 = 0;
  local_920 = 0;
  local_918 = 0;
  local_950 = (int *)0x0;
  local_3f8 = &local_9a0;
  if (local_998 != (int *)0x0) {
    local_3fc = 0xffffffff;
    LOCK();
    local_400 = *local_998;
    *local_998 = *local_998 + -1;
    UNLOCK();
    if (local_400 == 1) {
      if (local_980 == (Allocator *)0x0) {
        local_2b0 = local_9a0;
        if (local_9a0 != (void *)0x0) {
          free(local_9a0);
        }
      }
      else {
        (*local_980->_vptr_Allocator[3])(local_980,local_9a0);
      }
    }
  }
  local_9a0 = (void *)0x0;
  local_990 = 0;
  local_988 = 0;
  local_978 = 0;
  local_974 = 0;
  local_970 = 0;
  local_96c = 0;
  local_968 = 0;
  local_960 = 0;
  local_998 = (int *)0x0;
  (**(code **)(*(long *)in_RDI[7] + 0x48))((long *)in_RDI[7],&local_9e8,local_848);
  local_808 = &local_be0;
  local_be0 = (void *)0x0;
  local_bd8 = (int *)0x0;
  local_bd0 = 0;
  local_bc8 = 0;
  local_bc0 = (Allocator *)0x0;
  local_bb8 = 0;
  local_bb4 = 0;
  local_bb0 = 0;
  local_bac = 0;
  local_ba8 = 0;
  local_ba0 = 0;
  (**(code **)(*(long *)in_RDI[3] + 0x38))((long *)in_RDI[3],local_860,&local_be0,local_848);
  local_390 = local_908 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
  local_3a0 = local_848[1];
  local_388 = &local_c28;
  local_38c = local_90c;
  local_398 = 4;
  local_c28 = (void *)0x0;
  local_c20 = (int *)0x0;
  local_c18 = 0;
  local_c10 = 0;
  local_c08 = (Allocator *)0x0;
  local_c00 = 0;
  local_bfc = 0;
  local_bf8 = 0;
  local_bf4 = 0;
  local_bf0 = 0;
  local_be8 = 0;
  Mat::create(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff038,
              (size_t)in_stack_fffffffffffff030,(Allocator *)in_stack_fffffffffffff028);
  for (local_c2c = 0; local_c2c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_c2c = local_c2c + 1) {
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1a352ec);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff040,
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
               in_stack_fffffffffffff030);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1a35315);
    local_34c = local_c2c * local_90c;
    local_340 = &local_c98;
    local_348 = &local_9e8;
    local_350 = local_90c;
    local_b4 = local_9bc;
    local_c0 = (void *)((long)local_9e8 + (long)local_9bc * (long)local_34c * local_9d8);
    local_c8 = local_9d8;
    local_cc = local_9d0;
    local_d8 = local_9c8;
    local_b0 = &local_c98;
    local_b8 = local_90c;
    local_c98.refcount = (int *)0x0;
    local_c98.elemsize = local_9d8;
    local_c98.elempack = local_9d0;
    local_c98.allocator = local_9c8;
    local_c98.dims = 2;
    local_c98.w = local_9bc;
    local_c98.h = local_90c;
    local_c98.d = 1;
    local_c98.c = 1;
    local_c98.cstep = (long)local_9bc * (long)local_90c;
    local_c98.data = local_c0;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_c48,0);
    local_6d8 = &local_c98;
    local_6d0 = pvVar4;
    if (pvVar4 != local_6d8) {
      if (local_c98.refcount != (int *)0x0) {
        local_6dc = 1;
        LOCK();
        local_6e0 = *local_c98.refcount;
        *local_c98.refcount = *local_c98.refcount + 1;
        UNLOCK();
      }
      local_5f8 = pvVar4;
      if (pvVar4->refcount != (int *)0x0) {
        piVar1 = pvVar4->refcount;
        local_5fc = 0xffffffff;
        LOCK();
        local_600 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_600 == 1) {
          if (pvVar4->allocator == (Allocator *)0x0) {
            local_1b0 = pvVar4->data;
            if (local_1b0 != (void *)0x0) {
              free(local_1b0);
            }
          }
          else {
            (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = local_6d8->data;
      pvVar4->refcount = local_6d8->refcount;
      pvVar4->elemsize = local_6d8->elemsize;
      pvVar4->elempack = local_6d8->elempack;
      pvVar4->allocator = local_6d8->allocator;
      pvVar4->dims = local_6d8->dims;
      pvVar4->w = local_6d8->w;
      pvVar4->h = local_6d8->h;
      pvVar4->d = local_6d8->d;
      pvVar4->c = local_6d8->c;
      pvVar4->cstep = local_6d8->cstep;
    }
    local_7c0 = &local_c98;
    local_6c8 = pvVar4;
    local_498 = local_7c0;
    if (local_c98.refcount != (int *)0x0) {
      local_49c = 0xffffffff;
      LOCK();
      local_4a0 = *local_c98.refcount;
      *local_c98.refcount = *local_c98.refcount + -1;
      UNLOCK();
      if (local_4a0 == 1) {
        if (local_c98.allocator == (Allocator *)0x0) {
          local_260 = local_c98.data;
          if (local_c98.data != (void *)0x0) {
            free(local_c98.data);
          }
        }
        else {
          (*(local_c98.allocator)->_vptr_Allocator[3])(local_c98.allocator,local_c98.data);
        }
      }
    }
    local_c98.data = (void *)0x0;
    local_c98.elemsize = 0;
    local_c98.elempack = 0;
    local_c98.dims = 0;
    local_c98.w = 0;
    local_c98.h = 0;
    local_c98.d = 0;
    local_c98.c = 0;
    local_c98.cstep = 0;
    local_c98.refcount = (int *)0x0;
    local_364 = local_c2c * local_908;
    local_358 = &local_ce0;
    local_360 = &local_be0;
    local_368 = local_908;
    local_84 = local_bb4;
    local_90 = (void *)((long)local_be0 + (long)local_bb4 * (long)local_364 * local_bd0);
    local_98 = local_bd0;
    local_9c = local_bc8;
    local_a8 = local_bc0;
    local_80 = &local_ce0;
    local_88 = local_908;
    local_ce0.refcount = (int *)0x0;
    local_ce0.elemsize = local_bd0;
    local_ce0.elempack = local_bc8;
    local_ce0.allocator = local_bc0;
    local_ce0.dims = 2;
    local_ce0.w = local_bb4;
    local_ce0.h = local_908;
    local_ce0.d = 1;
    local_ce0.c = 1;
    local_ce0.cstep = (long)local_bb4 * (long)local_908;
    local_ce0.data = local_90;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_c48,1);
    local_6f8 = &local_ce0;
    local_6f0 = pvVar4;
    if (pvVar4 != local_6f8) {
      if (local_ce0.refcount != (int *)0x0) {
        local_6fc = 1;
        LOCK();
        local_700 = *local_ce0.refcount;
        *local_ce0.refcount = *local_ce0.refcount + 1;
        UNLOCK();
      }
      local_5e8 = pvVar4;
      if (pvVar4->refcount != (int *)0x0) {
        piVar1 = pvVar4->refcount;
        local_5ec = 0xffffffff;
        LOCK();
        local_5f0 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_5f0 == 1) {
          if (pvVar4->allocator == (Allocator *)0x0) {
            local_1b8 = pvVar4->data;
            if (local_1b8 != (void *)0x0) {
              free(local_1b8);
            }
          }
          else {
            (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = local_6f8->data;
      pvVar4->refcount = local_6f8->refcount;
      pvVar4->elemsize = local_6f8->elemsize;
      pvVar4->elempack = local_6f8->elempack;
      pvVar4->allocator = local_6f8->allocator;
      pvVar4->dims = local_6f8->dims;
      pvVar4->w = local_6f8->w;
      pvVar4->h = local_6f8->h;
      pvVar4->d = local_6f8->d;
      pvVar4->c = local_6f8->c;
      pvVar4->cstep = local_6f8->cstep;
    }
    local_7b0 = &local_ce0;
    local_6e8 = pvVar4;
    local_4b8 = local_7b0;
    if (local_ce0.refcount != (int *)0x0) {
      local_4bc = 0xffffffff;
      LOCK();
      local_4c0 = *local_ce0.refcount;
      *local_ce0.refcount = *local_ce0.refcount + -1;
      UNLOCK();
      if (local_4c0 == 1) {
        if (local_ce0.allocator == (Allocator *)0x0) {
          local_250 = local_ce0.data;
          if (local_ce0.data != (void *)0x0) {
            free(local_ce0.data);
          }
        }
        else {
          (*(local_ce0.allocator)->_vptr_Allocator[3])(local_ce0.allocator,local_ce0.data);
        }
      }
    }
    local_ce0.data = (void *)0x0;
    local_ce0.elemsize = 0;
    local_ce0.elempack = 0;
    local_ce0.dims = 0;
    local_ce0.w = 0;
    local_ce0.h = 0;
    local_ce0.d = 0;
    local_ce0.c = 0;
    local_ce0.cstep = 0;
    local_ce0.refcount = (int *)0x0;
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1a35c79);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff040,
               CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
               in_stack_fffffffffffff030);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1a35ca2);
    local_37c = local_c2c * local_908;
    local_370 = &local_d48;
    local_378 = &local_c28;
    local_380 = local_908;
    local_54 = local_bfc;
    local_60 = (void *)((long)local_c28 + (long)local_bfc * (long)local_37c * local_c18);
    local_68 = local_c18;
    local_6c = local_c10;
    local_78 = local_c08;
    local_50 = &local_d48;
    local_58 = local_908;
    local_d48.refcount = (int *)0x0;
    local_d48.elemsize = local_c18;
    local_d48.elempack = local_c10;
    local_d48.allocator = local_c08;
    local_d48.dims = 2;
    local_d48.w = local_bfc;
    local_d48.h = local_908;
    local_d48.d = 1;
    local_d48.c = 1;
    local_d48.cstep = (long)local_bfc * (long)local_908;
    local_d48.data = local_60;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_cf8,0);
    local_718 = &local_d48;
    local_710 = pvVar4;
    if (pvVar4 != local_718) {
      if (local_d48.refcount != (int *)0x0) {
        local_71c = 1;
        LOCK();
        local_720 = *local_d48.refcount;
        *local_d48.refcount = *local_d48.refcount + 1;
        UNLOCK();
      }
      local_5d8 = pvVar4;
      if (pvVar4->refcount != (int *)0x0) {
        piVar1 = pvVar4->refcount;
        local_5dc = 0xffffffff;
        LOCK();
        local_5e0 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_5e0 == 1) {
          if (pvVar4->allocator == (Allocator *)0x0) {
            local_1c0 = pvVar4->data;
            if (local_1c0 != (void *)0x0) {
              free(local_1c0);
            }
          }
          else {
            (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = local_718->data;
      pvVar4->refcount = local_718->refcount;
      pvVar4->elemsize = local_718->elemsize;
      pvVar4->elempack = local_718->elempack;
      pvVar4->allocator = local_718->allocator;
      pvVar4->dims = local_718->dims;
      pvVar4->w = local_718->w;
      pvVar4->h = local_718->h;
      pvVar4->d = local_718->d;
      pvVar4->c = local_718->c;
      pvVar4->cstep = local_718->cstep;
    }
    local_7a0 = &local_d48;
    local_708 = pvVar4;
    local_4d8 = local_7a0;
    if (local_d48.refcount != (int *)0x0) {
      local_4dc = 0xffffffff;
      LOCK();
      local_4e0 = *local_d48.refcount;
      *local_d48.refcount = *local_d48.refcount + -1;
      UNLOCK();
      if (local_4e0 == 1) {
        if (local_d48.allocator == (Allocator *)0x0) {
          local_240 = local_d48.data;
          if (local_d48.data != (void *)0x0) {
            free(local_d48.data);
          }
        }
        else {
          (*(local_d48.allocator)->_vptr_Allocator[3])(local_d48.allocator,local_d48.data);
        }
      }
    }
    local_d48.data = (void *)0x0;
    local_d48.elemsize = 0;
    local_d48.elempack = 0;
    local_d48.dims = 0;
    local_d48.w = 0;
    local_d48.h = 0;
    local_d48.d = 0;
    local_d48.c = 0;
    local_d48.cstep = 0;
    local_d48.refcount = (int *)0x0;
    uStack_d80 = local_848[1];
    uStack_d78 = local_848[2];
    uStack_d70 = local_848[3];
    local_d68 = local_848[4];
    uStack_d60 = local_848[5];
    uStack_d58 = local_848[6];
    uStack_d50 = local_848[7];
    _local_d88 = CONCAT44(1,(int)*local_848);
    (**(code **)(*(long *)in_RDI[6] + 0x30))((long *)in_RDI[6],&local_c48,&local_cf8,&local_d88);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff030);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff030);
  }
  local_408 = &local_be0;
  if (local_bd8 != (int *)0x0) {
    local_40c = 0xffffffff;
    LOCK();
    local_410 = *local_bd8;
    *local_bd8 = *local_bd8 + -1;
    UNLOCK();
    if (local_410 == 1) {
      if (local_bc0 == (Allocator *)0x0) {
        local_2a8 = local_be0;
        if (local_be0 != (void *)0x0) {
          free(local_be0);
        }
      }
      else {
        (*local_bc0->_vptr_Allocator[3])(local_bc0,local_be0);
      }
    }
  }
  local_be0 = (void *)0x0;
  local_bd0 = 0;
  local_bc8 = 0;
  local_bb8 = 0;
  local_bb4 = 0;
  local_bb0 = 0;
  local_bac = 0;
  local_ba8 = 0;
  local_ba0 = 0;
  local_bd8 = (int *)0x0;
  plVar2 = (long *)in_RDI[4];
  pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_840,0);
  (**(code **)(*plVar2 + 0x38))(plVar2,&local_c28,pvVar4,local_848);
  local_790 = &local_c28;
  local_4f8 = local_790;
  if (local_c20 != (int *)0x0) {
    local_4fc = 0xffffffff;
    LOCK();
    local_500 = *local_c20;
    *local_c20 = *local_c20 + -1;
    UNLOCK();
    if (local_500 == 1) {
      if (local_c08 == (Allocator *)0x0) {
        local_230 = local_c28;
        if (local_c28 != (void *)0x0) {
          free(local_c28);
        }
      }
      else {
        (*local_c08->_vptr_Allocator[3])(local_c08,local_c28);
      }
    }
  }
  local_c28 = (void *)0x0;
  local_c18 = 0;
  local_c10 = 0;
  local_c00 = 0;
  local_bfc = 0;
  local_bf8 = 0;
  local_bf4 = 0;
  local_bf0 = 0;
  local_be8 = 0;
  local_c20 = (int *)0x0;
  local_780 = &local_be0;
  local_518 = local_780;
  if (local_bd8 != (int *)0x0) {
    local_51c = 0xffffffff;
    LOCK();
    local_520 = *local_bd8;
    *local_bd8 = *local_bd8 + -1;
    UNLOCK();
    if (local_520 == 1) {
      if (local_bc0 == (Allocator *)0x0) {
        local_220 = local_be0;
        if (local_be0 != (void *)0x0) {
          free(local_be0);
        }
      }
      else {
        (*local_bc0->_vptr_Allocator[3])(local_bc0,local_be0);
      }
    }
  }
  local_be0 = (void *)0x0;
  local_bd0 = 0;
  local_bc8 = 0;
  local_bb8 = 0;
  local_bb4 = 0;
  local_bb0 = 0;
  local_bac = 0;
  local_ba8 = 0;
  local_ba0 = 0;
  local_bd8 = (int *)0x0;
  local_770 = &local_9e8;
  local_538 = local_770;
  if (local_9e0 != (int *)0x0) {
    local_53c = 0xffffffff;
    LOCK();
    local_540 = *local_9e0;
    *local_9e0 = *local_9e0 + -1;
    UNLOCK();
    if (local_540 == 1) {
      if (local_9c8 == (Allocator *)0x0) {
        local_210 = local_9e8;
        if (local_9e8 != (void *)0x0) {
          free(local_9e8);
        }
      }
      else {
        (*local_9c8->_vptr_Allocator[3])(local_9c8,local_9e8);
      }
    }
  }
  local_9e8 = (void *)0x0;
  local_9d8 = 0;
  local_9d0 = 0;
  local_9c0 = 0;
  local_9bc = 0;
  local_9b8 = 0;
  local_9b4 = 0;
  local_9b0 = 0;
  local_9a8 = 0;
  local_9e0 = (int *)0x0;
  local_760 = &local_9a0;
  local_558 = local_760;
  if (local_998 != (int *)0x0) {
    local_55c = 0xffffffff;
    LOCK();
    local_560 = *local_998;
    *local_998 = *local_998 + -1;
    UNLOCK();
    if (local_560 == 1) {
      if (local_980 == (Allocator *)0x0) {
        local_200 = local_9a0;
        if (local_9a0 != (void *)0x0) {
          free(local_9a0);
        }
      }
      else {
        (*local_980->_vptr_Allocator[3])(local_980,local_9a0);
      }
    }
  }
  local_9a0 = (void *)0x0;
  local_990 = 0;
  local_988 = 0;
  local_978 = 0;
  local_974 = 0;
  local_970 = 0;
  local_96c = 0;
  local_968 = 0;
  local_960 = 0;
  local_998 = (int *)0x0;
  local_750 = &local_958;
  local_578 = local_750;
  if (local_950 != (int *)0x0) {
    local_57c = 0xffffffff;
    LOCK();
    local_580 = *local_950;
    *local_950 = *local_950 + -1;
    UNLOCK();
    if (local_580 == 1) {
      if (local_938 == (Allocator *)0x0) {
        local_1f0 = local_958;
        if (local_958 != (void *)0x0) {
          free(local_958);
        }
      }
      else {
        (*local_938->_vptr_Allocator[3])(local_938,local_958);
      }
    }
  }
  local_958 = (void *)0x0;
  local_948 = 0;
  local_940 = 0;
  local_930 = 0;
  local_92c = 0;
  local_928 = 0;
  local_924 = 0;
  local_920 = 0;
  local_918 = 0;
  local_950 = (int *)0x0;
  ppvVar5 = &local_8f8;
  local_740 = ppvVar5;
  local_598 = ppvVar5;
  if (local_8f0 != (int *)0x0) {
    local_59c = 0xffffffff;
    LOCK();
    local_5a0 = *local_8f0;
    *local_8f0 = *local_8f0 + -1;
    UNLOCK();
    if (local_5a0 == 1) {
      if (local_8d8 == (Allocator *)0x0) {
        local_1e0 = local_8f8;
        if (local_8f8 != (void *)0x0) {
          free(local_8f8);
        }
      }
      else {
        (*local_8d8->_vptr_Allocator[3])(local_8d8,local_8f8);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  ppvVar5 = &local_8b0;
  if (local_8a8 != (int *)0x0) {
    local_5bc = 0xffffffff;
    LOCK();
    local_5c0 = *local_8a8;
    *local_8a8 = *local_8a8 + -1;
    UNLOCK();
    if (local_5c0 == 1) {
      local_730 = ppvVar5;
      local_5b8 = ppvVar5;
      if (local_890 == (Allocator *)0x0) {
        local_1d0 = local_8b0;
        if (local_8b0 != (void *)0x0) {
          free(local_8b0);
        }
      }
      else {
        (*local_890->_vptr_Allocator[3])(local_890,local_8b0);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  return 0;
}

Assistant:

int MultiHeadAttention_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Mat attn_mask_blob_unpacked;
    if (attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    q_gemm->forward(q_blob, q_affine, opt);

    Mat k_affine;
    k_gemm->forward(k_blob, k_affine, opt);

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }

    q_affine.release();
    k_affine.release();

    qk_softmax->forward_inplace(qk_cross, opt);

    Mat v_affine;
    v_gemm->forward(v_blob, v_affine, opt);

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }

    v_affine.release();

    o_gemm->forward(qkv_cross, top_blobs[0], opt);

    return 0;
}